

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void visuals_reset(char *title,wchar_t row)

{
  reset_visuals(true);
  prt("",L'\0',L'\0');
  msg("Visual attr/char tables reset.");
  event_signal(EVENT_MESSAGE_FLUSH);
  return;
}

Assistant:

static void visuals_reset(const char *title, int row)
{
	/* Reset */
	reset_visuals(true);

	/* Message */
	prt("", 0, 0);
	msg("Visual attr/char tables reset.");
	event_signal(EVENT_MESSAGE_FLUSH);
}